

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O0

bool __thiscall NurseSolution::hasHistoryConflict(NurseSolution *this,Turn *turnToCheck)

{
  bool bVar1;
  int iVar2;
  History *pHVar3;
  string *psVar4;
  Scenario *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *this_01;
  mapped_type *this_02;
  ShiftType *this_03;
  Turn *turnToCheck_local;
  NurseSolution *this_local;
  
  iVar2 = Turn::getDay(turnToCheck);
  if (iVar2 == 0) {
    pHVar3 = Nurse::getHistory(this->nurse);
    psVar4 = History::getLastAssignedShiftType_abi_cxx11_(pHVar3);
    bVar1 = std::operator==(psVar4,"None");
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = Scenario::getInstance();
      this_01 = Scenario::getShifts_abi_cxx11_(this_00);
      pHVar3 = Nurse::getHistory(this->nurse);
      psVar4 = History::getLastAssignedShiftType_abi_cxx11_(pHVar3);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                ::at(this_01,psVar4);
      this_03 = Turn::getShiftType(turnToCheck);
      psVar4 = ShiftType::getId_abi_cxx11_(this_03);
      this_local._7_1_ = ShiftType::isForbiddenShift(this_02,psVar4);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

const bool NurseSolution::hasHistoryConflict(const Turn *turnToCheck) const {
    if (turnToCheck->getDay() != 0)
        return false;

    if (nurse->getHistory().getLastAssignedShiftType() == "None")
        return false;

    return Scenario::getInstance()->getShifts()
            .at(nurse->getHistory().getLastAssignedShiftType())
            .isForbiddenShift(turnToCheck->getShiftType()->getId());
}